

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O2

bool __thiscall ON_Mesh::ReverseTextureCoordinates(ON_Mesh *this,int dir)

{
  int iVar1;
  uint uVar2;
  double dVar3;
  uint i;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  float *pfVar7;
  ulong uVar8;
  ON_2fPoint *pOVar9;
  ulong uVar10;
  ON_Interval tex_dom;
  
  if ((uint)dir < 2) {
    iVar1 = (this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
    bVar4 = false;
    if ((0 < iVar1) &&
       (bVar4 = false, (this->m_T).super_ON_SimpleArray<ON_2fPoint>.m_count == iVar1)) {
      bVar4 = HasPackedTextureRegion(this);
      bVar5 = ON_MappingTag::IsSet(&this->m_Ttag);
      bVar6 = true;
      if (bVar5) {
        bVar6 = ON_MappingTag::IsDefaultSurfaceParameterMapping(&this->m_Ttag);
      }
      uVar2 = (this->m_T).super_ON_SimpleArray<ON_2fPoint>.m_count;
      if ((bVar4 & bVar6) == 0) {
        uVar8 = 0;
        uVar10 = (ulong)uVar2;
        if ((int)uVar2 < 1) {
          uVar10 = uVar8;
        }
        pOVar9 = (this->m_T).super_ON_SimpleArray<ON_2fPoint>.m_a;
        for (; uVar10 != uVar8; uVar8 = uVar8 + 1) {
          (&pOVar9[uVar8].x)[dir != 0] = 1.0 - (&pOVar9[uVar8].x)[dir != 0];
        }
      }
      else {
        i = 1 - dir;
        if (this->m_packed_tex_rotate == false) {
          i = dir;
        }
        tex_dom.m_t[0] = this->m_srf_scale[(ulong)i * 2 + 2];
        tex_dom.m_t[1] = this->m_srf_scale[(ulong)i * 2 + 3];
        ON_Interval::Swap((ON_Interval *)(this->m_srf_scale + (ulong)i * 2 + 2));
        uVar8 = 0;
        uVar10 = (ulong)uVar2;
        if ((int)uVar2 < 1) {
          uVar10 = uVar8;
        }
        for (; uVar10 * 8 != uVar8; uVar8 = uVar8 + 8) {
          pOVar9 = (ON_2fPoint *)
                   ((long)&((this->m_T).super_ON_SimpleArray<ON_2fPoint>.m_a)->x + uVar8);
          pfVar7 = ON_2fPoint::operator[](pOVar9,i);
          dVar3 = ON_Interval::NormalizedParameterAt(&tex_dom,(double)*pfVar7);
          dVar3 = ON_Interval::ParameterAt(&tex_dom,1.0 - dVar3);
          (&pOVar9->x)[i != 0] = (float)dVar3;
        }
      }
      InvalidateCachedTextureCoordinates(this,false);
      bVar4 = true;
    }
    return bVar4;
  }
  return false;
}

Assistant:

bool ON_Mesh::ReverseTextureCoordinates( int dir )
{
  if ( dir < 0 || dir > 1 || !HasTextureCoordinates() )
    return false;

  bool bPackedRegion =  HasPackedTextureRegion();

  bool bSrfParamTag = (!m_Ttag.IsSet() || m_Ttag.IsDefaultSurfaceParameterMapping());

  const int vcount = m_T.Count();
  int i;
  if ( bPackedRegion && bSrfParamTag )
  {
    // The region of the bitmap the texture uses 
    // cannot change.  The texture coordinates 
    // themselves get reflected in the subrectangle
    // about either the lowerleft to upperright
    // diagonal (llur = true) or the lowerright
    // to upperleft diagonal (llur = false).
    if ( m_packed_tex_rotate )
      dir = 1-dir;
    const ON_Interval tex_dom = m_packed_tex_domain[dir];
    double s;
    m_packed_tex_domain[dir].Swap(); // Swap() is correct - Reverse() is wrong.
    for (i = 0; i < vcount; i++ )
    {
      ON_2fPoint& tc = m_T[i];
      s = 1.0 - tex_dom.NormalizedParameterAt(tc[dir]);
      if ( dir )
        tc.y = (float)tex_dom.ParameterAt(s);
      else
        tc.x = (float)tex_dom.ParameterAt(s);
    }
  }
  else
  {
    for (i = 0; i < vcount; i++ )
    {
      ON_2fPoint& tc = m_T[i];
      if ( dir )
        tc.y = 1.0f-tc.y;
      else
        tc.x = 1.0f-tc.x;
    }
  }
  // 12 Jan 2024 - Jeff: https://mcneel.myjetbrains.com/youtrack/issue/RH-79611
  InvalidateCachedTextureCoordinates();
  return true;
}